

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O2

void __thiscall Map::Country::Country(Country *this,Country *toCopy)

{
  pointer ppCVar1;
  vector<Map::Country*,std::allocator<Map::Country*>> *this_00;
  Country *in_RAX;
  ostream *poVar2;
  int *piVar3;
  string *this_01;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this_02;
  Country *this_03;
  pointer ppCVar4;
  Country *local_38;
  
  local_38 = in_RAX;
  poVar2 = std::operator<<((ostream *)&std::cout,"In country copy constructor:");
  std::operator<<(poVar2,(string *)toCopy->cyName);
  piVar3 = (int *)operator_new(4);
  *piVar3 = *toCopy->cyID;
  this->cyID = piVar3;
  this_01 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_01,(string *)toCopy->cyName);
  this->cyName = this_01;
  piVar3 = (int *)operator_new(4);
  *piVar3 = *toCopy->cyContinent;
  this->cyContinent = piVar3;
  piVar3 = (int *)operator_new(4);
  *piVar3 = *toCopy->pPlayerOwnerId;
  this->pPlayerOwnerId = piVar3;
  piVar3 = (int *)operator_new(4);
  *piVar3 = *toCopy->pNumberOfTroops;
  this->pNumberOfTroops = piVar3;
  this_02 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  (this_02->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_02->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_02->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->pAdjCountries = this_02;
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::reserve
            (this_02,(long)(toCopy->pAdjCountries->
                           super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(toCopy->pAdjCountries->
                           super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3);
  ppCVar1 = (toCopy->pAdjCountries->
            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar4 = (toCopy->pAdjCountries->
                 super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppCVar4 != ppCVar1; ppCVar4 = ppCVar4 + 1) {
    this_00 = (vector<Map::Country*,std::allocator<Map::Country*>> *)this->pAdjCountries;
    this_03 = (Country *)operator_new(0x30);
    Country(this_03,*ppCVar4);
    local_38 = this_03;
    std::vector<Map::Country*,std::allocator<Map::Country*>>::emplace_back<Map::Country*>
              (this_00,&local_38);
  }
  return;
}

Assistant:

Map::Country::Country(const Country& toCopy) {
    std::cout << "In country copy constructor:" << *toCopy.cyName;
    this->cyID = new int(*toCopy.cyID);
    this->cyName = new std::string(*toCopy.cyName);
    this->cyContinent = new int(*toCopy.cyContinent);
    this->pPlayerOwnerId = new int(*toCopy.pPlayerOwnerId);
    this->pNumberOfTroops = new int(*toCopy.pNumberOfTroops);
    this->pAdjCountries = new std::vector<Country*>();
    this->pAdjCountries->reserve(toCopy.pAdjCountries->size());
    for(auto & pAdjCountry : *toCopy.pAdjCountries) {
        this->pAdjCountries->push_back(new Country(*pAdjCountry));
    }
}